

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
MarshalAllPropertiesToScriptContext
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,ScriptContext *targetScriptContext,bool invalidateFixedFields)

{
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar1;
  ScriptContext *scriptContext;
  JavascriptString *propertyKey;
  JavascriptString **ppJVar2;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  Var pvVar3;
  int iVar4;
  undefined7 in_register_00000009;
  int iVar5;
  
  if ((int)CONCAT71(in_register_00000009,invalidateFixedFields) != 0) {
    pBVar1 = (this->propertyMap).ptr;
    iVar4 = pBVar1->count - pBVar1->freeCount;
    scriptContext =
         (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
    iVar5 = 0;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    for (; iVar4 != iVar5; iVar5 = iVar5 + 1) {
      ppJVar2 = JsUtil::
                BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                ::GetKeyAt((this->propertyMap).ptr,iVar5);
      propertyKey = *ppJVar2;
      descriptor = JsUtil::
                   BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetReferenceAt((this->propertyMap).ptr,iVar5);
      SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
      InvalidateFixedField<Js::JavascriptString*>
                ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,
                 propertyKey,descriptor,scriptContext);
    }
  }
  iVar4 = this->nextPropertyIndex;
  iVar5 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
    iVar5 = 0;
  }
  for (; iVar4 != iVar5; iVar5 = iVar5 + 1) {
    pvVar3 = DynamicTypeHandler::GetSlot(&this->super_DynamicTypeHandler,instance,iVar5);
    pvVar3 = CrossSite::MarshalVar(targetScriptContext,pvVar3,false);
    DynamicTypeHandler::SetSlotUnchecked(instance,iVar5,pvVar3);
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::MarshalAllPropertiesToScriptContext(DynamicObject* instance, ScriptContext* targetScriptContext, bool invalidateFixedFields)
    {
        // Note: This method is currently only called from ResetObject, which in turn only applies to external objects.
        // Before using for other purposes, make sure the assumptions made here make sense in the new context.  In particular,
        // the invalidateFixedFields == false is only correct if a) the object is known not to have any, or b) the type of the
        // object has changed and/or property guards have already been invalidated through some other means.
#if ENABLE_FIXED_FIELDS
        int propertyCount = this->propertyMap->Count();

        if (invalidateFixedFields)
        {
            ScriptContext* scriptContext = instance->GetScriptContext();
            for (int propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
            {
                const TMapKey propertyRecord = this->propertyMap->GetKeyAt(propertyIndex);
                SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor = this->propertyMap->GetReferenceAt(propertyIndex);
                InvalidateFixedField(propertyRecord, descriptor, scriptContext);
            }
        }
#endif

        int slotCount = this->nextPropertyIndex;
        for (int slotIndex = 0; slotIndex < slotCount; slotIndex++)
        {
            SetSlotUnchecked(instance, slotIndex, CrossSite::MarshalVar(targetScriptContext, GetSlot(instance, slotIndex)));
        }
    }